

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBooleanStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::BooleanStateQueryVerifiers::GetBooleanVerifier::verifyBoolean4
          (GetBooleanVerifier *this,TestContext *testCtx,GLenum name,bool reference0,bool reference1
          ,bool reference2,bool reference3)

{
  bool bVar1;
  qpTestResult qVar2;
  uchar (*pauVar3) [4];
  TestLog *this_00;
  MessageBuilder *pMVar4;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8 [3];
  MessageBuilder local_1b0;
  uchar local_30;
  uchar local_2f;
  uchar local_2e;
  uchar local_2d;
  undefined1 local_2c [4];
  GLboolean referenceAsGLBoolean [4];
  StateQueryMemoryWriteGuard<unsigned_char[4]> boolVector4;
  bool reference3_local;
  bool reference2_local;
  bool reference1_local;
  bool reference0_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetBooleanVerifier *this_local;
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[4]>::
  StateQueryMemoryWriteGuard((StateQueryMemoryWriteGuard<unsigned_char[4]> *)local_2c);
  pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_2c);
  glu::CallLogWrapper::glGetBooleanv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,*pauVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[4]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<unsigned_char[4]> *)local_2c,testCtx);
  if (bVar1) {
    local_2d = reference3;
    local_30 = reference0;
    local_2f = reference1;
    local_2e = reference2;
    pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_2c);
    if (((((*pauVar3)[0] != local_30) ||
         (pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                    operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_2c),
         (*pauVar3)[1] != local_2f)) ||
        (pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                   operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_2c),
        (*pauVar3)[2] != local_2e)) ||
       (pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_2c),
       (*pauVar3)[3] != local_2d)) {
      this_00 = tcu::TestContext::getLog(testCtx);
      tcu::TestLog::operator<<(&local_1b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_1b0,(char (*) [20])"// ERROR: expected ");
      local_1c8[0] = "mapped_ == GL_FALSE";
      if (local_30 != '\0') {
        local_1c8[0] = "mapped_ == GL_TRUE";
      }
      local_1c8[0] = local_1c8[0] + 0xb;
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_1c8);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2c7b4d6);
      local_1d0 = "mapped_ == GL_FALSE";
      if (local_2f != '\0') {
        local_1d0 = "mapped_ == GL_TRUE";
      }
      local_1d0 = local_1d0 + 0xb;
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1d0);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2c7b4d6);
      local_1d8 = "mapped_ == GL_FALSE";
      if (local_2e != '\0') {
        local_1d8 = "mapped_ == GL_TRUE";
      }
      local_1d8 = local_1d8 + 0xb;
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1d8);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2c7b4d6);
      local_1e0 = "mapped_ == GL_FALSE";
      if (local_2d != '\0') {
        local_1e0 = "mapped_ == GL_TRUE";
      }
      local_1e0 = local_1e0 + 0xb;
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1e0);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1b0);
      qVar2 = tcu::TestContext::getTestResult(testCtx);
      if (qVar2 == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean value");
      }
    }
  }
  return;
}

Assistant:

void GetBooleanVerifier::verifyBoolean4 (tcu::TestContext& testCtx, GLenum name, bool reference0, bool reference1, bool reference2, bool reference3)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLboolean[4]> boolVector4;
	glGetBooleanv(name, boolVector4);

	if (!boolVector4.verifyValidity(testCtx))
		return;

	const GLboolean referenceAsGLBoolean[] =
	{
		reference0 ? GLboolean(GL_TRUE) : GLboolean(GL_FALSE),
		reference1 ? GLboolean(GL_TRUE) : GLboolean(GL_FALSE),
		reference2 ? GLboolean(GL_TRUE) : GLboolean(GL_FALSE),
		reference3 ? GLboolean(GL_TRUE) : GLboolean(GL_FALSE),
	};

	if (boolVector4[0] != referenceAsGLBoolean[0] ||
		boolVector4[1] != referenceAsGLBoolean[1] ||
		boolVector4[2] != referenceAsGLBoolean[2] ||
		boolVector4[3] != referenceAsGLBoolean[3])
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected "
			<< (referenceAsGLBoolean[0] ? "GL_TRUE" : "GL_FALSE") << " "
			<< (referenceAsGLBoolean[1] ? "GL_TRUE" : "GL_FALSE") << " "
			<< (referenceAsGLBoolean[2] ? "GL_TRUE" : "GL_FALSE") << " "
			<< (referenceAsGLBoolean[3] ? "GL_TRUE" : "GL_FALSE") << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
	}
}